

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O1

void __thiscall Assimp::DeboneProcess::DeboneProcess(DeboneProcess *this)

{
  BaseProcess::BaseProcess(&this->super_BaseProcess);
  (this->super_BaseProcess)._vptr_BaseProcess = (_func_int **)&PTR__DeboneProcess_00259588;
  (this->mSubMeshIndices).
  super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mSubMeshIndices).
  super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mSubMeshIndices).
  super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mNumBones = 0;
  this->mNumBonesCanDoWithout = 0;
  this->mThreshold = 1.0;
  this->mAllOrNone = false;
  return;
}

Assistant:

DeboneProcess::DeboneProcess()
{
    mNumBones = 0;
    mNumBonesCanDoWithout = 0;

    mThreshold = AI_DEBONE_THRESHOLD;
    mAllOrNone = false;
}